

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regex_tree.cpp
# Opt level: O2

StateSet * __thiscall RegexTree::lastpos(StateSet *__return_storage_ptr__,RegexTree *this)

{
  StateSet st;
  _Hashtable<const_tree_node_*,_const_tree_node_*,_std::allocator<const_tree_node_*>,_std::__detail::_Identity,_std::equal_to<const_tree_node_*>,_std::hash<const_tree_node_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_48;
  
  local_48._M_buckets = &local_48._M_single_bucket;
  local_48._M_bucket_count = 1;
  local_48._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_48._M_element_count = 0;
  local_48._M_rehash_policy._M_max_load_factor = 1.0;
  local_48._M_rehash_policy._M_next_resize = 0;
  local_48._M_single_bucket = (__node_base_ptr)0x0;
  lastpos(this->root,(StateSet *)&local_48);
  std::
  _Hashtable<const_tree_node_*,_const_tree_node_*,_std::allocator<const_tree_node_*>,_std::__detail::_Identity,_std::equal_to<const_tree_node_*>,_std::hash<const_tree_node_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::_Hashtable(&__return_storage_ptr__->_M_h,&local_48);
  std::
  _Hashtable<const_tree_node_*,_const_tree_node_*,_std::allocator<const_tree_node_*>,_std::__detail::_Identity,_std::equal_to<const_tree_node_*>,_std::hash<const_tree_node_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&local_48);
  return __return_storage_ptr__;
}

Assistant:

RegexTree::StateSet RegexTree::lastpos() const {
    StateSet st;
    lastpos(root, st);
    return std::move(st);
}